

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.c
# Opt level: O0

void GenerateHelp(void)

{
  sprintf(HelpString,"  double key .. move to color stack or cancel action\n");
  FormatCmdHelp(HelpString,CMD_NEXT,"draw next card");
  FormatCmdHelp(HelpString,CMD_PACK,"choose current card from the pack");
  FormatCmdHelp(HelpString,CMD_COLOR0,"choose stack of spades");
  FormatCmdHelp(HelpString,CMD_COLOR1,"choose stack of hearts");
  FormatCmdHelp(HelpString,CMD_COLOR2,"choose stack of clubs");
  FormatCmdHelp(HelpString,CMD_COLOR3,"choose stack of diamonds");
  FormatCmdHelp(HelpString,CMD_DESK0,"choose desk stack 1");
  FormatCmdHelp(HelpString,CMD_DESK1,"choose desk stack 2");
  FormatCmdHelp(HelpString,CMD_DESK2,"choose desk stack 3");
  FormatCmdHelp(HelpString,CMD_DESK3,"choose desk stack 4");
  FormatCmdHelp(HelpString,CMD_DESK4,"choose desk stack 5");
  FormatCmdHelp(HelpString,CMD_DESK5,"choose desk stack 6");
  FormatCmdHelp(HelpString,CMD_DESK6,"choose desk stack 7");
  FormatCmdHelp(HelpString,CMD_SCHEME,"change text color scheme");
  FormatCmdHelp(HelpString,CMD_HELP,"show/hide help");
  FormatCmdHelp(HelpString,CMD_RESET,"restart game");
  FormatCmdHelp(HelpString,CMD_EXIT,"quit game");
  return;
}

Assistant:

static void GenerateHelp(void)
{
  sprintf(HelpString, "  double key .. move to color stack or cancel action\n");
  FormatCmdHelp(HelpString, CMD_NEXT, "draw next card");
  FormatCmdHelp(HelpString, CMD_PACK, "choose current card from the pack");
  FormatCmdHelp(HelpString, CMD_COLOR0, "choose stack of spades");
  FormatCmdHelp(HelpString, CMD_COLOR1, "choose stack of hearts");
  FormatCmdHelp(HelpString, CMD_COLOR2, "choose stack of clubs");
  FormatCmdHelp(HelpString, CMD_COLOR3, "choose stack of diamonds");
  FormatCmdHelp(HelpString, CMD_DESK0, "choose desk stack 1");
  FormatCmdHelp(HelpString, CMD_DESK1, "choose desk stack 2");
  FormatCmdHelp(HelpString, CMD_DESK2, "choose desk stack 3");
  FormatCmdHelp(HelpString, CMD_DESK3, "choose desk stack 4");
  FormatCmdHelp(HelpString, CMD_DESK4, "choose desk stack 5");
  FormatCmdHelp(HelpString, CMD_DESK5, "choose desk stack 6");
  FormatCmdHelp(HelpString, CMD_DESK6, "choose desk stack 7");
  FormatCmdHelp(HelpString, CMD_SCHEME, "change text color scheme");
  FormatCmdHelp(HelpString, CMD_HELP, "show/hide help");
  FormatCmdHelp(HelpString, CMD_RESET, "restart game");
  FormatCmdHelp(HelpString, CMD_EXIT, "quit game");
}